

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void Application::glfw_key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  void *pvVar1;
  ImGuiContext *pIVar2;
  int in_ECX;
  int in_ESI;
  Application *app;
  GLFWwindow *in_stack_ffffffffffffffd8;
  
  pvVar1 = glfwGetWindowUserPointer(in_stack_ffffffffffffffd8);
  pIVar2 = ImGui::GetCurrentContext();
  if ((((pIVar2->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar2 = ImGui::GetCurrentContext(), (pIVar2->NavWindow->Flags & 0x2000U) != 0)) &&
      (in_ECX == 1)) && (in_ESI == 0x58)) {
    *(bool *)((long)pvVar1 + 0x174) = (*(byte *)((long)pvVar1 + 0x174) & 1) != 1;
  }
  return;
}

Assistant:

void Application::glfw_key_callback(GLFWwindow *window, int key, int scancode, int action, int mods) {
	auto *app = (Application *)glfwGetWindowUserPointer(window);
	if (!ImGui::GetCurrentContext()->NavWindow ||
	    (ImGui::GetCurrentContext()->NavWindow->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) {
		if (action == GLFW_PRESS && key == GLFW_KEY_X)
			app->m_ui_display_flag ^= 1u;
	}
}